

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Path * Path::home(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *ch;
  Path *in_RDI;
  Path local_58;
  String local_38;
  
  ch = getenv("HOME");
  String::String(&local_38,ch,0xffffffffffffffff);
  paVar1 = &local_58.super_String.mString.field_2;
  local_58.super_String.mString._M_string_length = 0;
  local_58.super_String.mString.field_2._M_local_buf[0] = '\0';
  local_58.super_String.mString._M_dataplus._M_p = (pointer)paVar1;
  resolved(in_RDI,&local_38,RealPath,&local_58,(bool *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_String.mString._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.super_String.mString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  sVar2 = (in_RDI->super_String).mString._M_string_length;
  if ((sVar2 == 0) || ((in_RDI->super_String).mString._M_dataplus._M_p[sVar2 - 1] != '/')) {
    std::__cxx11::string::push_back((char)in_RDI);
  }
  return in_RDI;
}

Assistant:

Path Path::home()
{
#ifdef _WIN32
    Path ret;

    // on windows, there is no definite "home" directory. If the HOME
    // environment variable is set, we use it. Otherwise, we use %USERPROFILE%,
    // which defaults to C:\User\<username>.
    // If %USERPROFILE% is not set, we use c:\.
    char *env;
    if((env = getenv("HOME")))
    {
        ret = env;
    }
    else if((env = getenv("USERPROFILE")))
    {
        ret = env;
    }
    else
    {
        ret = "c:/";
    }
#else
    Path ret = Path::resolved(getenv("HOME"));
#endif
    if (!ret.endsWith('/'))
        ret.append('/');
    return ret;
}